

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::createUniqueFile(Twine *Model,SmallVectorImpl<char> *ResultPath,uint Mode)

{
  undefined8 in_RAX;
  error_code eVar1;
  int FD;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  eVar1 = createUniqueFile(Model,&local_14,ResultPath,Mode);
  if (eVar1._M_value == 0) {
    close(local_14);
  }
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code createUniqueFile(const Twine &Model,
                                 SmallVectorImpl<char> &ResultPath,
                                 unsigned Mode) {
  int FD;
  auto EC = createUniqueFile(Model, FD, ResultPath, Mode);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}